

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_bind_pointer
              (sqlite3_stmt *pStmt,int i,void *pPtr,char *zPTtype,_func_void_void_ptr *xDestructor)

{
  int iVar1;
  char *in_RCX;
  Vdbe *in_RDX;
  undefined4 in_ESI;
  _func_void_void_ptr *in_R8;
  Vdbe *p;
  int rc;
  undefined4 in_stack_fffffffffffffff0;
  
  iVar1 = vdbeUnbind(in_RDX,(uint)((ulong)in_RCX >> 0x20));
  if (iVar1 == 0) {
    sqlite3VdbeMemSetPointer((Mem *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,in_RCX,in_R8);
    sqlite3_mutex_leave((sqlite3_mutex *)0x1412cb);
  }
  else if (in_R8 != (_func_void_void_ptr *)0x0) {
    (*in_R8)(in_RDX);
  }
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_bind_pointer(
  sqlite3_stmt *pStmt,
  int i,
  void *pPtr,
  const char *zPTtype,
  void (*xDestructor)(void*)
){
  int rc;
  Vdbe *p = (Vdbe*)pStmt;
  rc = vdbeUnbind(p, (u32)(i-1));
  if( rc==SQLITE_OK ){
    assert( p!=0 && p->aVar!=0 && i>0 && i<=p->nVar ); /* tag-20240917-01 */
    sqlite3VdbeMemSetPointer(&p->aVar[i-1], pPtr, zPTtype, xDestructor);
    sqlite3_mutex_leave(p->db->mutex);
  }else if( xDestructor ){
    xDestructor(pPtr);
  }
  return rc;
}